

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlTablePass.h
# Opt level: O1

GdlRule * __thiscall GdlPass::NewRule(GdlPass *this,GrpLineAndFile *lnf)

{
  pointer *pppGVar1;
  iterator __position;
  int iVar2;
  GdlRule *this_00;
  GdlRule *pruleNew;
  GdlRule *local_20;
  
  this_00 = (GdlRule *)operator_new(0x128);
  GdlObject::GdlObject((GdlObject *)this_00);
  (this_00->m_vfOptRangeContext).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->m_vfOptRangeContext).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this_00->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->m_vpexpConstraints).
  super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->m_vpexpConstraints).
  super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->m_vpexpConstraints).
  super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->m_vpalias).super__Vector_base<GdlAlias_*,_std::allocator<GdlAlias_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->m_vpalias).super__Vector_base<GdlAlias_*,_std::allocator<GdlAlias_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->m_vpalias).super__Vector_base<GdlAlias_*,_std::allocator<GdlAlias_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->m_vfOptRangeContext).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->m_vfOptRangeContext).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (this_00->m_vfOptRangeContext).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this_00->m_viritOptRangeStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->m_viritOptRangeStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->m_viritOptRangeStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->m_viritOptRangeEnd).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->m_viritOptRangeEnd).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->m_viritOptRangeEnd).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->m_viritInput).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->m_viritInput).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->m_viritInput).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->m_viritOutput).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->m_viritOutput).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->m_viritOutput).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->m_nScanAdvance = -1;
  this_00->m_nDefaultAdvance = -1;
  this_00->m_fBadRule = false;
  this_00->m_fAutoAssoc = false;
  iVar2 = lnf->m_nLineOrig;
  (this_00->super_GdlObject).m_lnf.m_nLinePre = lnf->m_nLinePre;
  (this_00->super_GdlObject).m_lnf.m_nLineOrig = iVar2;
  local_20 = this_00;
  std::__cxx11::string::_M_assign((string *)&(this_00->super_GdlObject).m_lnf.m_staFile);
  __position._M_current =
       (this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<GdlRule*,std::allocator<GdlRule*>>::_M_realloc_insert<GdlRule*const&>
              ((vector<GdlRule*,std::allocator<GdlRule*>> *)&this->m_vprule,__position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    pppGVar1 = &(this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppGVar1 = *pppGVar1 + 1;
  }
  return local_20;
}

Assistant:

GdlRule * NewRule(GrpLineAndFile & lnf)
	{
		GdlRule * pruleNew = new GdlRule();
		pruleNew->SetLineAndFile(lnf);
		m_vprule.push_back(pruleNew);
		return pruleNew;
	}